

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.c
# Opt level: O3

int get_test_set(int *test_set,int limit,char *test,test_list_t *tests)

{
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  uint uVar6;
  char cVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  char cVar14;
  char *pcVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  
  auVar3 = _DAT_00115030;
  if (test == (char *)0x0) {
    if (limit < 1) {
      return limit;
    }
    lVar4 = (ulong)(uint)limit - 1;
    auVar16._8_4_ = (int)lVar4;
    auVar16._0_8_ = lVar4;
    auVar16._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar16 = auVar16 ^ _DAT_00115030;
    auVar20 = _DAT_00115020;
    do {
      auVar19 = auVar20 ^ auVar3;
      if ((bool)(~(auVar19._4_4_ == auVar16._4_4_ && auVar16._0_4_ < auVar19._0_4_ ||
                  auVar16._4_4_ < auVar19._4_4_) & 1)) {
        test_set[uVar5] = (int)uVar5;
      }
      if ((auVar19._12_4_ != auVar16._12_4_ || auVar19._8_4_ <= auVar16._8_4_) &&
          auVar19._12_4_ <= auVar16._12_4_) {
        test_set[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar4 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 2;
      auVar20._8_8_ = lVar4 + 2;
    } while ((limit + 1U & 0xfffffffe) != uVar5);
    return limit;
  }
  cVar7 = *test;
  if ((byte)(cVar7 - 0x30U) < 10) {
    pcVar15 = test + 2;
    iVar11 = 0;
    do {
      iVar10 = iVar11;
      pcVar12 = pcVar15;
      bVar8 = cVar7 - 0x30;
      iVar11 = (uint)bVar8 + iVar10 * 10;
      cVar7 = pcVar12[-1];
      pcVar15 = pcVar12 + 1;
    } while ((byte)(cVar7 - 0x30U) < 10);
    iVar9 = iVar11;
    if (cVar7 != '\0') {
      if (cVar7 != '-') {
        return -1;
      }
      cVar7 = *pcVar12;
      if (cVar7 == '\0') {
        iVar9 = limit + -1;
      }
      else {
        iVar9 = 0;
        if ((byte)(cVar7 - 0x30U) < 10) {
          iVar9 = 0;
          do {
            iVar9 = (uint)(byte)(cVar7 - 0x30) + iVar9 * 10;
            cVar7 = *pcVar15;
            pcVar15 = pcVar15 + 1;
          } while ((byte)(cVar7 - 0x30U) < 10);
        }
      }
    }
    if (iVar11 < 0) {
      return -1;
    }
    if (limit <= iVar9) {
      return -1;
    }
    if (iVar9 < iVar11) {
      return -1;
    }
    uVar6 = (iVar9 - iVar11) + 1;
    lVar4 = (ulong)uVar6 - 1;
    auVar17._8_4_ = (int)lVar4;
    auVar17._0_8_ = lVar4;
    auVar17._12_4_ = (int)((ulong)lVar4 >> 0x20);
    iVar11 = (uint)bVar8 + iVar10 * 10;
    uVar5 = 0;
    auVar17 = auVar17 ^ _DAT_00115030;
    auVar19 = _DAT_00115010;
    auVar18 = _DAT_00115020;
    do {
      auVar20 = auVar18 ^ auVar3;
      iVar9 = auVar17._4_4_;
      iVar10 = (int)uVar5;
      if ((bool)(~(auVar20._4_4_ == iVar9 && auVar17._0_4_ < auVar20._0_4_ || iVar9 < auVar20._4_4_)
                & 1)) {
        test_set[uVar5] = iVar11 + iVar10;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        test_set[uVar5 + 1] = iVar11 + iVar10 + 1;
      }
      iVar21 = SUB164(auVar19 ^ auVar3,4);
      if (iVar21 <= iVar9 && (iVar21 != iVar9 || SUB164(auVar19 ^ auVar3,0) <= auVar17._0_4_)) {
        test_set[uVar5 + 2] = iVar11 + iVar10 + 2;
        test_set[uVar5 + 3] = iVar11 + iVar10 + 3;
      }
      uVar5 = uVar5 + 4;
      lVar4 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar4 + 4;
      lVar4 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar4 + 4;
    } while (((ulong)uVar6 + 3 & 0xfffffffffffffffc) != uVar5);
LAB_00104a9a:
    if (uVar6 != 0) {
      return uVar6;
    }
  }
  else if (0 < limit) {
    uVar5 = 0;
    uVar6 = 0;
LAB_001048ad:
    pcVar15 = tests[uVar5].name;
    cVar7 = *test;
    pcVar12 = test + (cVar7 == '^');
    do {
      cVar14 = *pcVar12;
      if (cVar14 != '\\') {
        if (cVar14 != '*') goto LAB_00104920;
        while (pcVar13 = pcVar12 + 1, cVar14 == '*') {
          pcVar12 = pcVar13;
          cVar14 = *pcVar13;
        }
        if (cVar14 == '\\') {
          cVar14 = *pcVar13;
          pcVar12 = pcVar13;
        }
        pcVar15 = strchr(pcVar15,(int)cVar14);
        if (pcVar15 != (char *)0x0) goto LAB_00104920;
LAB_00104932:
        bVar2 = false;
        bVar1 = true;
        goto LAB_00104942;
      }
      cVar14 = pcVar12[1];
      pcVar12 = pcVar12 + 1;
LAB_00104920:
      if (cVar14 != *pcVar15) goto LAB_00104932;
      if (cVar14 == '\0') goto LAB_0010493b;
      pcVar12 = pcVar12 + 1;
      pcVar15 = pcVar15 + 1;
    } while( true );
  }
  return -1;
LAB_0010493b:
  bVar2 = true;
  bVar1 = false;
LAB_00104942:
  if (cVar7 != '^') {
    bVar1 = bVar2;
  }
  if (bVar1) {
    lVar4 = (long)(int)uVar6;
    uVar6 = uVar6 + 1;
    test_set[lVar4] = (int)uVar5;
  }
  uVar5 = uVar5 + 1;
  if (uVar5 == (uint)limit) goto LAB_00104a9a;
  goto LAB_001048ad;
}

Assistant:

int get_test_set(int *test_set, int limit, const char *test,
	struct test_list_t *tests)
{
	int start, end;
	int idx = 0;

	if (test == NULL) {
		/* Default: Run all tests. */
		for (;idx < limit; idx++)
			test_set[idx] = idx;
		return (limit);
	}
	if (*test >= '0' && *test <= '9') {
		const char *vp = test;
		start = 0;
		while (*vp >= '0' && *vp <= '9') {
			start *= 10;
			start += *vp - '0';
			++vp;
		}
		if (*vp == '\0') {
			end = start;
		} else if (*vp == '-') {
			++vp;
			if (*vp == '\0') {
				end = limit - 1;
			} else {
				end = 0;
				while (*vp >= '0' && *vp <= '9') {
					end *= 10;
					end += *vp - '0';
					++vp;
				}
			}
		} else
			return (-1);
		if (start < 0 || end >= limit || start > end)
			return (-1);
		while (start <= end)
			test_set[idx++] = start++;
	} else {
		for (start = 0; start < limit; ++start) {
			const char *name = tests[start].name;
			if (test_filter(test, name))
				test_set[idx++] = start;
		}
	}
	return ((idx == 0)?-1:idx);
}